

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,float thickness)

{
  int in_ECX;
  uint in_EDX;
  long in_RDI;
  float in_XMM0_Da;
  undefined4 in_XMM1_Da;
  float a_max;
  int in_stack_00000048;
  float in_stack_0000004c;
  float in_stack_00000050;
  float in_stack_00000054;
  ImVec2 *in_stack_00000058;
  ImDrawList *in_stack_00000060;
  ImDrawFlags in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  
  if (((in_EDX & 0xff000000) != 0) && (0.0 < in_XMM0_Da)) {
    if (in_ECX < 1) {
      _PathArcToFastEx(this,center,radius,col,num_segments,(int)thickness);
      *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x78) + -1;
    }
    else {
      in_ECX = ImClamp<int>(in_ECX,3,0x200);
      in_stack_ffffffffffffffdc = (((float)in_ECX - 1.0) * 6.2831855) / (float)in_ECX;
      PathArcTo(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000050,
                in_stack_0000004c,in_stack_00000048);
    }
    PathStroke((ImDrawList *)CONCAT44(in_ECX,in_XMM1_Da),(ImU32)in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8,(float)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    if (num_segments <= 0)
    {
        // Use arc with automatic segment count
        _PathArcToFastEx(center, radius - 0.5f, 0, IM_DRAWLIST_ARCFAST_SAMPLE_MAX, 0);
        _Path.Size--;
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);

        // Because we are filling a closed shape we remove 1 from the count of segments/points
        const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
        PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    }

    PathStroke(col, ImDrawFlags_Closed, thickness);
}